

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.cpp
# Opt level: O0

bool jhu::thrax::isConsistent(Alignment *a,SpanPair sp)

{
  anon_class_10_2_3cea27bd_for__M_pred __pred;
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  undefined2 uStack_3a;
  undefined6 local_38;
  undefined2 uStack_32;
  anon_class_1_0_00000001 contains;
  Alignment *a_local;
  SpanPair sp_local;
  
  __first = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::begin(a);
  __last = std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::end(a);
  local_38 = sp._0_6_;
  uStack_32 = sp.tgt.end;
  __pred.sp.src.start = (undefined2)local_38;
  __pred.sp.src.end = local_38._2_2_;
  __pred.sp.tgt.start = local_38._4_2_;
  __pred._0_2_ = uStack_3a;
  __pred.sp.tgt.end = uStack_32;
  bVar1 = std::
          none_of<__gnu_cxx::__normal_iterator<jhu::thrax::Point_const*,std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>>,jhu::thrax::isConsistent(std::vector<jhu::thrax::Point,std::allocator<jhu::thrax::Point>>const&,jhu::thrax::SpanPair)::__0>
                    ((__normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_jhu::thrax::Point_*,_std::vector<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>_>
                      )__last._M_current,__pred);
  return bVar1;
}

Assistant:

bool isConsistent(const Alignment& a, SpanPair sp) {
  constexpr auto contains = [](IndexType p, Span s) {
    return p >= s.start && p < s.end;
  };
  return std::none_of(
      a.begin(),
      a.end(),
      [contains,sp](Point p) {
        return contains(p.src, sp.src) ^ contains(p.tgt, sp.tgt);
      });
}